

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int wally_descriptor_create_checksum
              (char *descriptor,char **key_name_array,char **key_value_array,size_t array_len,
              uint32_t flags,char **output)

{
  int iVar1;
  char *pcVar2;
  char *ignore_checksum_descriptor;
  char checksum [9];
  char **script_ignore_checksum;
  char local_39 [9];
  
  script_ignore_checksum = (char **)0x0;
  iVar1 = -2;
  if (((flags == 0) && (descriptor != (char *)0x0)) && (output != (char **)0x0)) {
    wally_bzero(local_39,9);
    iVar1 = parse_miniscript(descriptor,key_name_array,key_value_array,array_len,0,3,(uint32_t *)0x0
                             ,0,0,(wally_descriptor_script_item *)0x0,0,
                             (uint32_t *)&stack0xffffffffffffffb8,script_ignore_checksum);
    if (iVar1 == 0) {
      iVar1 = generate_descriptor_checksum((char *)script_ignore_checksum,local_39);
      if (iVar1 == 0) {
        pcVar2 = wally_strdup(local_39);
        *output = pcVar2;
        iVar1 = (uint)(pcVar2 != (char *)0x0) * 3 + -3;
      }
      wally_free_string((char *)script_ignore_checksum);
    }
  }
  return iVar1;
}

Assistant:

int wally_descriptor_create_checksum(
    const char *descriptor,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t flags,
    char **output)
{
    int ret = WALLY_OK;
    char checksum[9];
    char *ignore_checksum_descriptor = NULL;

    if (!descriptor || !output || flags)
        return WALLY_EINVAL;

    wally_bzero(checksum, sizeof(checksum));
    ret = parse_miniscript(
        descriptor,
        key_name_array,
        key_value_array,
        array_len,
        flags,
        DESCRIPTOR_KIND_MINISCRIPT | DESCRIPTOR_KIND_DESCRIPTOR,
        NULL,
        0,
        0,
        NULL,
        0,
        NULL,
        &ignore_checksum_descriptor);
    if (ret != WALLY_OK)
        return ret;

    ret = generate_descriptor_checksum(ignore_checksum_descriptor, checksum);
    if (ret == WALLY_OK) {
        *output = wally_strdup(checksum);
        if (*output == NULL)
            ret = WALLY_ENOMEM;
    }
    wally_free_string(ignore_checksum_descriptor);
    return ret;
}